

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# listmenu.cpp
# Opt level: O2

FListMenuItem * __thiscall DListMenu::GetItem(DListMenu *this,FName *name)

{
  FListMenuItem *pFVar1;
  uint i;
  ulong uVar2;
  FName nm;
  int local_2c;
  
  uVar2 = 0;
  while( true ) {
    if ((this->mDesc->mItems).super_TArray<FListMenuItem_*,_FListMenuItem_*>.Count <= uVar2) {
      return (FListMenuItem *)0x0;
    }
    pFVar1 = (this->mDesc->mItems).super_TArray<FListMenuItem_*,_FListMenuItem_*>.Array[uVar2];
    (*pFVar1->_vptr_FListMenuItem[7])(&local_2c,pFVar1,0);
    if (local_2c == name->Index) break;
    uVar2 = uVar2 + 1;
  }
  return (this->mDesc->mItems).super_TArray<FListMenuItem_*,_FListMenuItem_*>.Array[uVar2];
}

Assistant:

FListMenuItem *DListMenu::GetItem(FName name)
{
	for(unsigned i=0;i<mDesc->mItems.Size(); i++)
	{
		FName nm = mDesc->mItems[i]->GetAction(NULL);
		if (nm == name) return mDesc->mItems[i];
	}
	return NULL;
}